

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

string * google::protobuf::compiler::cpp::Formatter::Payload<google::protobuf::FieldDescriptor>
                   (FieldDescriptor *descriptor)

{
  GeneratedCodeInfo_Annotation *this;
  GeneratedCodeInfo_Annotation *pGVar1;
  FileDescriptor *this_00;
  FieldDescriptor *in_RSI;
  string *in_RDI;
  int i;
  Annotation annotation;
  vector<int,_std::allocator<int>_> path;
  undefined4 in_stack_ffffffffffffff58;
  int32 in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  int iVar2;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff88;
  FieldDescriptor *in_stack_ffffffffffffff90;
  vector<int,_std::allocator<int>_> local_28;
  FieldDescriptor *local_10;
  
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x514af6);
  FieldDescriptor::GetLocationPath(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  GeneratedCodeInfo_Annotation::GeneratedCodeInfo_Annotation
            ((GeneratedCodeInfo_Annotation *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  iVar2 = 0;
  while( true ) {
    this = (GeneratedCodeInfo_Annotation *)(long)iVar2;
    pGVar1 = (GeneratedCodeInfo_Annotation *)std::vector<int,_std::allocator<int>_>::size(&local_28)
    ;
    if (pGVar1 <= this) break;
    std::vector<int,_std::allocator<int>_>::operator[](&local_28,(long)iVar2);
    GeneratedCodeInfo_Annotation::add_path(this,in_stack_ffffffffffffff5c);
    iVar2 = iVar2 + 1;
  }
  this_00 = FieldDescriptor::file(local_10);
  FileDescriptor::name_abi_cxx11_(this_00);
  GeneratedCodeInfo_Annotation::set_source_file
            (this,(string *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  MessageLite::SerializeAsString_abi_cxx11_((MessageLite *)in_stack_ffffffffffffff88);
  GeneratedCodeInfo_Annotation::~GeneratedCodeInfo_Annotation(this);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
  return in_RDI;
}

Assistant:

static std::string Payload(const Descriptor* descriptor) {
    std::vector<int> path;
    descriptor->GetLocationPath(&path);
    GeneratedCodeInfo::Annotation annotation;
    for (int i = 0; i < path.size(); ++i) {
      annotation.add_path(path[i]);
    }
    annotation.set_source_file(descriptor->file()->name());
    return annotation.SerializeAsString();
  }